

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O1

int run_test_tcp_bind_error_addrnotavail_1(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *unaff_RBX;
  char *loop;
  sockaddr_in addr;
  uv_tcp_t server;
  sockaddr_in sStack_a08;
  uv_buf_t uStack_9f8;
  undefined1 auStack_9e8 [328];
  undefined1 auStack_8a0 [192];
  void *pvStack_7e0;
  uv_tcp_t uStack_7d0;
  uv_loop_t *puStack_6d8;
  sockaddr_in sStack_6c8;
  uv_tcp_t uStack_6b8;
  uv_loop_t *puStack_5c0;
  sockaddr_in sStack_5b0;
  uv_tcp_t uStack_5a0;
  uv_loop_t *puStack_4a8;
  sockaddr_in sStack_498;
  sockaddr_in sStack_488;
  uv_tcp_t uStack_478;
  uv_loop_t *puStack_380;
  sockaddr sStack_378;
  char acStack_368 [56];
  uv_tcp_t uStack_330;
  uv_loop_t *puStack_238;
  sockaddr_in sStack_228;
  uv_tcp_t uStack_218;
  uv_loop_t *puStack_120;
  sockaddr_in local_110;
  uv_tcp_t local_100;
  
  puStack_120 = (uv_loop_t *)0x17aafd;
  iVar1 = uv_ip4_addr("127.255.255.255",0x23a3,&local_110);
  if (iVar1 == 0) {
    puStack_120 = (uv_loop_t *)0x17ab0a;
    puVar2 = uv_default_loop();
    puStack_120 = (uv_loop_t *)0x17ab17;
    iVar1 = uv_tcp_init(puVar2,&local_100);
    if (iVar1 != 0) goto LAB_0017abaf;
    puStack_120 = (uv_loop_t *)0x17ab30;
    iVar1 = uv_tcp_bind(&local_100,(sockaddr *)&local_110,0);
    if ((iVar1 == -99) || (iVar1 == 0)) {
      puStack_120 = (uv_loop_t *)0x17ab4e;
      uv_close((uv_handle_t *)&local_100,close_cb);
      puStack_120 = (uv_loop_t *)0x17ab53;
      puVar2 = uv_default_loop();
      puStack_120 = (uv_loop_t *)0x17ab5d;
      uv_run(puVar2,UV_RUN_DEFAULT);
      if (close_cb_called != 1) goto LAB_0017abb4;
      puStack_120 = (uv_loop_t *)0x17ab6b;
      unaff_RBX = uv_default_loop();
      puStack_120 = (uv_loop_t *)0x17ab7f;
      uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
      puStack_120 = (uv_loop_t *)0x17ab89;
      uv_run(unaff_RBX,UV_RUN_DEFAULT);
      puStack_120 = (uv_loop_t *)0x17ab8e;
      puVar2 = uv_default_loop();
      puStack_120 = (uv_loop_t *)0x17ab96;
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        puStack_120 = (uv_loop_t *)0x17ab9f;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0017abb9;
    }
  }
  else {
    puStack_120 = (uv_loop_t *)0x17abaf;
    run_test_tcp_bind_error_addrnotavail_1_cold_1();
LAB_0017abaf:
    puStack_120 = (uv_loop_t *)0x17abb4;
    run_test_tcp_bind_error_addrnotavail_1_cold_2();
LAB_0017abb4:
    puStack_120 = (uv_loop_t *)0x17abb9;
    run_test_tcp_bind_error_addrnotavail_1_cold_3();
LAB_0017abb9:
    puStack_120 = (uv_loop_t *)0x17abbe;
    run_test_tcp_bind_error_addrnotavail_1_cold_4();
  }
  puStack_120 = (uv_loop_t *)run_test_tcp_bind_error_addrnotavail_2;
  run_test_tcp_bind_error_addrnotavail_1_cold_5();
  puStack_238 = (uv_loop_t *)0x17abe1;
  puStack_120 = unaff_RBX;
  iVar1 = uv_ip4_addr("4.4.4.4",0x23a3,&sStack_228);
  if (iVar1 == 0) {
    puStack_238 = (uv_loop_t *)0x17abee;
    puVar2 = uv_default_loop();
    puStack_238 = (uv_loop_t *)0x17abfb;
    iVar1 = uv_tcp_init(puVar2,&uStack_218);
    if (iVar1 != 0) goto LAB_0017ac8b;
    puStack_238 = (uv_loop_t *)0x17ac14;
    iVar1 = uv_tcp_bind(&uStack_218,(sockaddr *)&sStack_228,0);
    if (iVar1 != -99) goto LAB_0017ac90;
    puStack_238 = (uv_loop_t *)0x17ac2a;
    uv_close((uv_handle_t *)&uStack_218,close_cb);
    puStack_238 = (uv_loop_t *)0x17ac2f;
    puVar2 = uv_default_loop();
    puStack_238 = (uv_loop_t *)0x17ac39;
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (close_cb_called != 1) goto LAB_0017ac95;
    puStack_238 = (uv_loop_t *)0x17ac47;
    unaff_RBX = uv_default_loop();
    puStack_238 = (uv_loop_t *)0x17ac5b;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_238 = (uv_loop_t *)0x17ac65;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puStack_238 = (uv_loop_t *)0x17ac6a;
    puVar2 = uv_default_loop();
    puStack_238 = (uv_loop_t *)0x17ac72;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      puStack_238 = (uv_loop_t *)0x17ac7b;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_238 = (uv_loop_t *)0x17ac8b;
    run_test_tcp_bind_error_addrnotavail_2_cold_1();
LAB_0017ac8b:
    puStack_238 = (uv_loop_t *)0x17ac90;
    run_test_tcp_bind_error_addrnotavail_2_cold_2();
LAB_0017ac90:
    puStack_238 = (uv_loop_t *)0x17ac95;
    run_test_tcp_bind_error_addrnotavail_2_cold_3();
LAB_0017ac95:
    puStack_238 = (uv_loop_t *)0x17ac9a;
    run_test_tcp_bind_error_addrnotavail_2_cold_4();
  }
  puStack_238 = (uv_loop_t *)run_test_tcp_bind_error_fault;
  run_test_tcp_bind_error_addrnotavail_2_cold_5();
  builtin_strncpy(acStack_368 + 0x20,"h blah blah",0xc);
  builtin_strncpy(acStack_368 + 0x10,"ah blah blah bla",0x10);
  builtin_strncpy(acStack_368,"lah blah blah bl",0x10);
  sStack_378._0_8_ = 0x616c622068616c62;
  builtin_strncpy(sStack_378.sa_data + 6,"h blah b",8);
  puStack_380 = (uv_loop_t *)0x17acdb;
  puStack_238 = unaff_RBX;
  puVar2 = uv_default_loop();
  puStack_380 = (uv_loop_t *)0x17ace8;
  iVar1 = uv_tcp_init(puVar2,&uStack_330);
  if (iVar1 == 0) {
    puStack_380 = (uv_loop_t *)0x17acff;
    iVar1 = uv_tcp_bind(&uStack_330,&sStack_378,0);
    if (iVar1 != -0x16) goto LAB_0017ad76;
    puStack_380 = (uv_loop_t *)0x17ad15;
    uv_close((uv_handle_t *)&uStack_330,close_cb);
    puStack_380 = (uv_loop_t *)0x17ad1a;
    puVar2 = uv_default_loop();
    puStack_380 = (uv_loop_t *)0x17ad24;
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (close_cb_called != 1) goto LAB_0017ad7b;
    puStack_380 = (uv_loop_t *)0x17ad32;
    unaff_RBX = uv_default_loop();
    puStack_380 = (uv_loop_t *)0x17ad46;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_380 = (uv_loop_t *)0x17ad50;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puStack_380 = (uv_loop_t *)0x17ad55;
    puVar2 = uv_default_loop();
    puStack_380 = (uv_loop_t *)0x17ad5d;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      puStack_380 = (uv_loop_t *)0x17ad66;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_380 = (uv_loop_t *)0x17ad76;
    run_test_tcp_bind_error_fault_cold_1();
LAB_0017ad76:
    puStack_380 = (uv_loop_t *)0x17ad7b;
    run_test_tcp_bind_error_fault_cold_2();
LAB_0017ad7b:
    puStack_380 = (uv_loop_t *)0x17ad80;
    run_test_tcp_bind_error_fault_cold_3();
  }
  puStack_380 = (uv_loop_t *)run_test_tcp_bind_error_inval;
  run_test_tcp_bind_error_fault_cold_4();
  puStack_4a8 = (uv_loop_t *)0x17ada3;
  puStack_380 = unaff_RBX;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&sStack_488);
  if (iVar1 == 0) {
    puStack_4a8 = (uv_loop_t *)0x17adc1;
    iVar1 = uv_ip4_addr("0.0.0.0",0x23a4,&sStack_498);
    if (iVar1 != 0) goto LAB_0017ae88;
    puStack_4a8 = (uv_loop_t *)0x17adce;
    puVar2 = uv_default_loop();
    puStack_4a8 = (uv_loop_t *)0x17addb;
    iVar1 = uv_tcp_init(puVar2,&uStack_478);
    if (iVar1 != 0) goto LAB_0017ae8d;
    puStack_4a8 = (uv_loop_t *)0x17adf4;
    iVar1 = uv_tcp_bind(&uStack_478,(sockaddr *)&sStack_488,0);
    if (iVar1 != 0) goto LAB_0017ae92;
    puStack_4a8 = (uv_loop_t *)0x17ae0d;
    iVar1 = uv_tcp_bind(&uStack_478,(sockaddr *)&sStack_498,0);
    if (iVar1 != -0x16) goto LAB_0017ae97;
    puStack_4a8 = (uv_loop_t *)0x17ae27;
    uv_close((uv_handle_t *)&uStack_478,close_cb);
    puStack_4a8 = (uv_loop_t *)0x17ae2c;
    puVar2 = uv_default_loop();
    puStack_4a8 = (uv_loop_t *)0x17ae36;
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (close_cb_called != 1) goto LAB_0017ae9c;
    puStack_4a8 = (uv_loop_t *)0x17ae44;
    unaff_RBX = uv_default_loop();
    puStack_4a8 = (uv_loop_t *)0x17ae58;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_4a8 = (uv_loop_t *)0x17ae62;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puStack_4a8 = (uv_loop_t *)0x17ae67;
    puVar2 = uv_default_loop();
    puStack_4a8 = (uv_loop_t *)0x17ae6f;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      puStack_4a8 = (uv_loop_t *)0x17ae78;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_4a8 = (uv_loop_t *)0x17ae88;
    run_test_tcp_bind_error_inval_cold_1();
LAB_0017ae88:
    puStack_4a8 = (uv_loop_t *)0x17ae8d;
    run_test_tcp_bind_error_inval_cold_2();
LAB_0017ae8d:
    puStack_4a8 = (uv_loop_t *)0x17ae92;
    run_test_tcp_bind_error_inval_cold_3();
LAB_0017ae92:
    puStack_4a8 = (uv_loop_t *)0x17ae97;
    run_test_tcp_bind_error_inval_cold_4();
LAB_0017ae97:
    puStack_4a8 = (uv_loop_t *)0x17ae9c;
    run_test_tcp_bind_error_inval_cold_5();
LAB_0017ae9c:
    puStack_4a8 = (uv_loop_t *)0x17aea1;
    run_test_tcp_bind_error_inval_cold_6();
  }
  puStack_4a8 = (uv_loop_t *)run_test_tcp_bind_localhost_ok;
  run_test_tcp_bind_error_inval_cold_7();
  puStack_5c0 = (uv_loop_t *)0x17aec4;
  puStack_4a8 = unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_5b0);
  if (iVar1 == 0) {
    puStack_5c0 = (uv_loop_t *)0x17aecd;
    puVar2 = uv_default_loop();
    puStack_5c0 = (uv_loop_t *)0x17aeda;
    iVar1 = uv_tcp_init(puVar2,&uStack_5a0);
    if (iVar1 != 0) goto LAB_0017af3c;
    puStack_5c0 = (uv_loop_t *)0x17aeef;
    iVar1 = uv_tcp_bind(&uStack_5a0,(sockaddr *)&sStack_5b0,0);
    if (iVar1 != 0) goto LAB_0017af41;
    puStack_5c0 = (uv_loop_t *)0x17aef8;
    unaff_RBX = uv_default_loop();
    puStack_5c0 = (uv_loop_t *)0x17af0c;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_5c0 = (uv_loop_t *)0x17af16;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puStack_5c0 = (uv_loop_t *)0x17af1b;
    puVar2 = uv_default_loop();
    puStack_5c0 = (uv_loop_t *)0x17af23;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      puStack_5c0 = (uv_loop_t *)0x17af2c;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_5c0 = (uv_loop_t *)0x17af3c;
    run_test_tcp_bind_localhost_ok_cold_1();
LAB_0017af3c:
    puStack_5c0 = (uv_loop_t *)0x17af41;
    run_test_tcp_bind_localhost_ok_cold_2();
LAB_0017af41:
    puStack_5c0 = (uv_loop_t *)0x17af46;
    run_test_tcp_bind_localhost_ok_cold_3();
  }
  puStack_5c0 = (uv_loop_t *)run_test_tcp_bind_invalid_flags;
  run_test_tcp_bind_localhost_ok_cold_4();
  puStack_6d8 = (uv_loop_t *)0x17af69;
  puStack_5c0 = unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_6c8);
  if (iVar1 == 0) {
    puStack_6d8 = (uv_loop_t *)0x17af72;
    puVar2 = uv_default_loop();
    puStack_6d8 = (uv_loop_t *)0x17af7f;
    iVar1 = uv_tcp_init(puVar2,&uStack_6b8);
    if (iVar1 != 0) goto LAB_0017afe5;
    puStack_6d8 = (uv_loop_t *)0x17af97;
    iVar1 = uv_tcp_bind(&uStack_6b8,(sockaddr *)&sStack_6c8,1);
    if (iVar1 != -0x16) goto LAB_0017afea;
    puStack_6d8 = (uv_loop_t *)0x17afa1;
    unaff_RBX = uv_default_loop();
    puStack_6d8 = (uv_loop_t *)0x17afb5;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_6d8 = (uv_loop_t *)0x17afbf;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puStack_6d8 = (uv_loop_t *)0x17afc4;
    puVar2 = uv_default_loop();
    puStack_6d8 = (uv_loop_t *)0x17afcc;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      puStack_6d8 = (uv_loop_t *)0x17afd5;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_6d8 = (uv_loop_t *)0x17afe5;
    run_test_tcp_bind_invalid_flags_cold_1();
LAB_0017afe5:
    puStack_6d8 = (uv_loop_t *)0x17afea;
    run_test_tcp_bind_invalid_flags_cold_2();
LAB_0017afea:
    puStack_6d8 = (uv_loop_t *)0x17afef;
    run_test_tcp_bind_invalid_flags_cold_3();
  }
  puStack_6d8 = (uv_loop_t *)run_test_tcp_listen_without_bind;
  run_test_tcp_bind_invalid_flags_cold_4();
  pvStack_7e0 = (void *)0x17b001;
  puStack_6d8 = unaff_RBX;
  puVar2 = uv_default_loop();
  pvStack_7e0 = (void *)0x17b00e;
  iVar1 = uv_tcp_init(puVar2,&uStack_7d0);
  if (iVar1 == 0) {
    pvStack_7e0 = (void *)0x17b023;
    iVar1 = uv_listen((uv_stream_t *)&uStack_7d0,0x80,(uv_connection_cb)0x0);
    if (iVar1 != 0) goto LAB_0017b070;
    pvStack_7e0 = (void *)0x17b02c;
    unaff_RBX = uv_default_loop();
    pvStack_7e0 = (void *)0x17b040;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    pvStack_7e0 = (void *)0x17b04a;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    pvStack_7e0 = (void *)0x17b04f;
    puVar2 = uv_default_loop();
    pvStack_7e0 = (void *)0x17b057;
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      pvStack_7e0 = (void *)0x17b060;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pvStack_7e0 = (void *)0x17b070;
    run_test_tcp_listen_without_bind_cold_1();
LAB_0017b070:
    pvStack_7e0 = (void *)0x17b075;
    run_test_tcp_listen_without_bind_cold_2();
  }
  pvStack_7e0 = run_test_tcp_bind_writable_flags;
  run_test_tcp_listen_without_bind_cold_3();
  loop = "0.0.0.0";
  pvStack_7e0 = unaff_RBX;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&sStack_a08);
  if (iVar1 == 0) {
    loop = (char *)uv_default_loop();
    iVar1 = uv_tcp_init((uv_loop_t *)loop,(uv_tcp_t *)auStack_9e8);
    if (iVar1 != 0) goto LAB_0017b1ff;
    loop = auStack_9e8;
    iVar1 = uv_tcp_bind((uv_tcp_t *)loop,(sockaddr *)&sStack_a08,0);
    if (iVar1 != 0) goto LAB_0017b204;
    loop = auStack_9e8;
    iVar1 = uv_listen((uv_stream_t *)loop,0x80,(uv_connection_cb)0x0);
    if (iVar1 != 0) goto LAB_0017b209;
    loop = auStack_9e8;
    iVar1 = uv_is_writable((uv_stream_t *)loop);
    if (iVar1 != 0) goto LAB_0017b20e;
    loop = auStack_9e8;
    iVar1 = uv_is_readable((uv_stream_t *)loop);
    if (iVar1 != 0) goto LAB_0017b213;
    uStack_9f8 = uv_buf_init("PING",4);
    loop = auStack_8a0;
    iVar1 = uv_write((uv_write_t *)loop,(uv_stream_t *)auStack_9e8,&uStack_9f8,1,(uv_write_cb)0x0);
    if (iVar1 != -0x20) goto LAB_0017b218;
    loop = auStack_9e8 + 0xf8;
    iVar1 = uv_shutdown((uv_shutdown_t *)loop,(uv_stream_t *)auStack_9e8,(uv_shutdown_cb)0x0);
    if (iVar1 != -0x6b) goto LAB_0017b21d;
    loop = auStack_9e8;
    iVar1 = uv_read_start((uv_stream_t *)loop,abort,abort);
    if (iVar1 != -0x6b) goto LAB_0017b222;
    uv_close((uv_handle_t *)auStack_9e8,close_cb);
    loop = (char *)uv_default_loop();
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    if (close_cb_called == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      loop = (char *)uv_default_loop();
      iVar1 = uv_loop_close((uv_loop_t *)loop);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0017b22c;
    }
  }
  else {
    run_test_tcp_bind_writable_flags_cold_1();
LAB_0017b1ff:
    run_test_tcp_bind_writable_flags_cold_2();
LAB_0017b204:
    run_test_tcp_bind_writable_flags_cold_3();
LAB_0017b209:
    run_test_tcp_bind_writable_flags_cold_4();
LAB_0017b20e:
    run_test_tcp_bind_writable_flags_cold_5();
LAB_0017b213:
    run_test_tcp_bind_writable_flags_cold_6();
LAB_0017b218:
    run_test_tcp_bind_writable_flags_cold_7();
LAB_0017b21d:
    run_test_tcp_bind_writable_flags_cold_8();
LAB_0017b222:
    run_test_tcp_bind_writable_flags_cold_9();
  }
  run_test_tcp_bind_writable_flags_cold_10();
LAB_0017b22c:
  run_test_tcp_bind_writable_flags_cold_11();
  iVar1 = uv_is_closing((uv_handle_t *)loop);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(tcp_bind_error_addrnotavail_1) {
  struct sockaddr_in addr;
  uv_tcp_t server;
  int r;

  ASSERT(0 == uv_ip4_addr("127.255.255.255", TEST_PORT, &addr));

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  /* It seems that Linux is broken here - bind succeeds. */
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0 || r == UV_EADDRNOTAVAIL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}